

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O2

int muduo::ProcessInfo::numThreads(void)

{
  int iVar1;
  long lVar2;
  string status;
  long local_30 [4];
  
  procStatus_abi_cxx11_();
  iVar1 = 0;
  lVar2 = std::__cxx11::string::find((char *)local_30,0x1217fb);
  if (lVar2 != -1) {
    iVar1 = atoi((char *)(local_30[0] + lVar2 + 8));
  }
  std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

int ProcessInfo::numThreads()
{
  int result = 0;
  string status = procStatus();
  size_t pos = status.find("Threads:");
  if (pos != string::npos)
  {
    result = ::atoi(status.c_str() + pos + 8);
  }
  return result;
}